

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem_unix.c
# Opt level: O3

w_status w_vmem_create(w_vmem *mem,void *addr,size_t size)

{
  int iVar1;
  void *__addr;
  int *piVar2;
  w_status wVar3;
  size_t local_30;
  
  if (mem == (w_vmem *)0x0) {
    w_handle_failed_assertion
              ("mem != NULL","w_vmem_create",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0x3f);
  }
  if (addr != (void *)0x0) {
    if (w_get_alloc_granularity::granularity == 0) {
      w_get_alloc_granularity::granularity = sysconf(0x1e);
    }
    if ((ulong)addr % w_get_alloc_granularity::granularity != 0) {
      w_handle_failed_assertion
                ("addr == NULL || (uintptr_t)addr % w_get_alloc_granularity() == 0","w_vmem_create",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
                 ,0x40);
    }
  }
  if (size == 0) {
    w_handle_failed_assertion
              ("size > 0","w_vmem_create",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0x41);
  }
  if (w_get_alloc_granularity::granularity == 0) {
    w_get_alloc_granularity::granularity = sysconf(0x1e);
  }
  if (size % w_get_alloc_granularity::granularity != 0) {
    w_handle_failed_assertion
              ("size % w_get_alloc_granularity() == 0","w_vmem_create",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0x42);
  }
  __addr = mmap(addr,size,0,(uint)(addr != (void *)0x0) << 4 | 0x22,-1,0);
  if (__addr == (void *)0xffffffffffffffff) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    if (addr == (void *)0x0) {
      wp_log(W_LOG_LVL_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
             ,0x53,"failed to reserve %zu bytes of virtual memory\n",size);
    }
    else {
      wp_log(W_LOG_LVL_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
             ,0x57,"failed to reserve %zu bytes of virtual memory at %p\n",size,addr);
    }
    wp_log_system_error(W_LOG_LVL_ALL,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
                        ,0x5a,iVar1);
    wVar3 = W_ERROR_ALLOC_FAILED;
  }
  else {
    iVar1 = madvise(__addr,size,4);
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      wp_log(W_LOG_LVL_WARNING,
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
             ,99,"failed to advise %zu bytes of virtual memory at %p\n",size,__addr);
      wp_log_system_error(W_LOG_LVL_ALL,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
                          ,100,iVar1);
    }
    mem->addr = __addr;
    iVar1 = w_mtx_lock(&wp_vmem_tracer_mtx);
    if (iVar1 != 0) {
      w_abort(-8);
    }
    local_30 = size;
    wp_trace_pool_insert_data
              (wp_vmem_tracer_inst.idx_pool,wp_vmem_tracer_inst.data_pool,0x400,8,mem,&local_30);
    iVar1 = w_mtx_unlock(&wp_vmem_tracer_mtx);
    wVar3 = W_SUCCESS;
    if (iVar1 != 0) {
      w_abort(-0xc);
      wVar3 = W_SUCCESS;
    }
  }
  return wVar3;
}

Assistant:

enum w_status
w_vmem_create(
    struct w_vmem *mem,
    void *addr,
    size_t size
)
{
    int flags;
    void *alloc;

    W_ASSERT(mem != NULL);
    W_ASSERT(addr == NULL || (uintptr_t)addr % w_get_alloc_granularity() == 0);
    W_ASSERT(size > 0);
    W_ASSERT(size % w_get_alloc_granularity() == 0);

    flags = MAP_PRIVATE | MAP_ANONYMOUS;
    if (addr != NULL)
    {
        flags |= MAP_FIXED;
    }

    alloc = mmap(addr, size, PROT_NONE, flags, -1, 0);
    if (alloc == MAP_FAILED)
    {
        int error;

        error = errno;

        if (addr == NULL)
        {
            W_LOG_ERROR(WP_VMEM_GET_ERROR_MSG_NO_ADDR("reserve"), size);
        }
        else 
        {
            W_LOG_ERROR(WP_VMEM_GET_ERROR_MSG("reserve"), size, addr);
        }

        W_LOG_SYSTEM_ERROR(W_LOG_LVL_DEBUG, error);
        return W_ERROR_ALLOC_FAILED;
    }

    if (madvise(alloc, size, MADV_DONTNEED) != 0)
    {
        int error;

        error = errno;
        W_LOG_WARNING(WP_VMEM_GET_ERROR_MSG("advise"), size, alloc);
        W_LOG_SYSTEM_ERROR(W_LOG_LVL_DEBUG, error);
    }

    mem->addr = alloc;

#if W_TRACING(ENABLED)
    {
        W_TRACER_ATTACH_DATA(
            wp_vmem_tracer,
            mem,
            (
                &(struct wp_vmem_trace_data) {
                    .size = size,
                }
            )
        );
    }
#endif

    return W_SUCCESS;
}